

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void forget_objects(int percent)

{
  int local_888 [2];
  int indices [538];
  int local_14;
  int local_10;
  int count;
  int i;
  int percent_local;
  
  if (percent != 0) {
    if ((percent < 1) || (100 < percent)) {
      impossible("forget_objects: bad percent %d",(ulong)(uint)percent);
    }
    else {
      local_14 = 0;
      for (local_10 = 1; local_10 < 0x21a; local_10 = local_10 + 1) {
        if ((obj_descr[objects[local_10].oc_descr_idx].oc_descr != (char *)0x0) &&
           (((objects[local_10].field_0x10 & 1) != 0 || (objects[local_10].oc_uname != (char *)0x0))
           )) {
          local_888[local_14] = local_10;
          local_14 = local_14 + 1;
        }
      }
      randomize(local_888,local_14);
      for (local_10 = 0; local_10 < (local_14 * percent + 0x32) / 100; local_10 = local_10 + 1) {
        forget_single_object(local_888[local_10]);
      }
    }
  }
  return;
}

Assistant:

void forget_objects(int percent)
{
	int i, count;
	int indices[NUM_OBJECTS];

	if (percent == 0) return;
	if (percent <= 0 || percent > 100) {
	    impossible("forget_objects: bad percent %d", percent);
	    return;
	}

	for (count = 0, i = 1; i < NUM_OBJECTS; i++)
	    if (OBJ_DESCR(objects[i]) &&
		    (objects[i].oc_name_known || objects[i].oc_uname))
		indices[count++] = i;

	randomize(indices, count);

	/* forget first % of randomized indices */
	count = ((count * percent) + 50) / 100;
	for (i = 0; i < count; i++)
	    forget_single_object(indices[i]);
}